

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall
FormatterTest_FormatExplicitlyConvertibleToStringView_Test::TestBody
          (FormatterTest_FormatExplicitlyConvertibleToStringView_Test *this)

{
  undefined1 uVar1;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  char (*expected) [4];
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  explicitly_convertible_to_string_view *in_stack_ffffffffffffffc0;
  char (*in_stack_ffffffffffffffc8) [3];
  AssertionResult local_18;
  
  expected = (char (*) [4])&stack0xffffffffffffffc8;
  fmt::v5::format<char[3],explicitly_convertible_to_string_view>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0,expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x125019);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff90));
    testing::Message::~Message((Message *)0x125065);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1250a5);
  return;
}

Assistant:

TEST(FormatterTest, FormatExplicitlyConvertibleToStringView) {
  EXPECT_EQ("foo", fmt::format("{}", explicitly_convertible_to_string_view()));
}